

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_block.cpp
# Opt level: O2

BlockInformationStruct *
cfd::js::api::ElementsBlockStructApi::GetBlockInfo
          (BlockInformationStruct *__return_storage_ptr__,BlockDataStruct *request)

{
  string *in_R8;
  allocator local_1a9;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)> local_188;
  BlockInformationStruct local_168;
  
  BlockInformationStruct::BlockInformationStruct(__return_storage_ptr__);
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_190 = std::
              _Function_handler<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_block.cpp:26:7)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_block.cpp:26:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_188,"GetBlockInfo",&local_1a9);
  ExecuteStructApi<cfd::js::api::BlockDataStruct,cfd::js::api::BlockInformationStruct>
            (&local_168,(api *)request,(BlockDataStruct *)&local_1a8,&local_188,in_R8);
  BlockInformationStruct::operator=(__return_storage_ptr__,&local_168);
  BlockInformationStruct::~BlockInformationStruct(&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

BlockInformationStruct ElementsBlockStructApi::GetBlockInfo(
    const BlockDataStruct& request) {
  auto call_func =
      [](const BlockDataStruct& request) -> BlockInformationStruct {  // NOLINT
    warn(CFD_LOG_SOURCE, "not implements. block:{}", request.block);
    throw CfdException(CfdError::kCfdIllegalStateError, "Not implements.");
  };

  BlockInformationStruct result;
  result = ExecuteStructApi<BlockDataStruct, BlockInformationStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}